

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O3

void __thiscall
llm_build_mamba::llm_build_mamba
          (llm_build_mamba *this,llama_model *model,llm_graph_params *params,ggml_cgraph *gf)

{
  ggml_tensor *pgVar1;
  ggml_tensor *state_copy;
  ggml_tensor *state_mask;
  ggml_tensor *pgVar2;
  ggml_tensor *pgVar3;
  long lVar4;
  int il;
  long lVar5;
  
  llm_graph_context::llm_graph_context(&this->super_llm_graph_context,params);
  this->model = model;
  pgVar1 = llm_graph_context::build_inp_embd(&this->super_llm_graph_context,model->tok_embd);
  state_copy = llm_graph_context::build_inp_s_copy(&this->super_llm_graph_context);
  state_mask = llm_graph_context::build_inp_s_mask(&this->super_llm_graph_context);
  if (0 < (this->super_llm_graph_context).n_layer) {
    lVar4 = 0;
    lVar5 = 0;
    do {
      il = (int)lVar5;
      pgVar2 = llm_graph_context::build_norm
                         (&this->super_llm_graph_context,pgVar1,
                          *(ggml_tensor **)
                           ((long)&((model->layers).
                                    super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                    _M_impl.super__Vector_impl_data._M_start)->attn_norm + lVar4),
                          (ggml_tensor *)0x0,LLM_NORM_RMS,il);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar2,"attn_norm",il);
      pgVar2 = build_mamba_layer(this,gf,pgVar2,state_copy,state_mask,
                                 (this->super_llm_graph_context).ubatch,il);
      if (lVar5 == (this->super_llm_graph_context).n_layer + -1) {
        pgVar3 = llm_graph_context::build_inp_out_ids(&this->super_llm_graph_context);
        pgVar2 = (ggml_tensor *)ggml_get_rows((this->super_llm_graph_context).ctx0,pgVar2,pgVar3);
        pgVar1 = (ggml_tensor *)ggml_get_rows((this->super_llm_graph_context).ctx0,pgVar1,pgVar3);
      }
      pgVar1 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar2,pgVar1);
      pgVar1 = llm_graph_context::build_cvec(&this->super_llm_graph_context,pgVar1,il);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar1,"l_out",il);
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0x4f0;
    } while (lVar5 < (this->super_llm_graph_context).n_layer);
  }
  pgVar1 = llm_graph_context::build_norm
                     (&this->super_llm_graph_context,pgVar1,model->output_norm,(ggml_tensor *)0x0,
                      LLM_NORM_RMS,-1);
  llm_graph_context::cb(&this->super_llm_graph_context,pgVar1,"result_norm",-1);
  ((this->super_llm_graph_context).res._M_t.
   super___uniq_ptr_impl<llm_graph_result,_std::default_delete<llm_graph_result>_>._M_t.
   super__Tuple_impl<0UL,_llm_graph_result_*,_std::default_delete<llm_graph_result>_>.
   super__Head_base<0UL,_llm_graph_result_*,_false>._M_head_impl)->t_embd = pgVar1;
  pgVar1 = llm_graph_context::build_lora_mm(&this->super_llm_graph_context,model->output,pgVar1);
  llm_graph_context::cb(&this->super_llm_graph_context,pgVar1,"result_output",-1);
  ((this->super_llm_graph_context).res._M_t.
   super___uniq_ptr_impl<llm_graph_result,_std::default_delete<llm_graph_result>_>._M_t.
   super__Tuple_impl<0UL,_llm_graph_result_*,_std::default_delete<llm_graph_result>_>.
   super__Head_base<0UL,_llm_graph_result_*,_false>._M_head_impl)->t_logits = pgVar1;
  ggml_build_forward_expand(gf,pgVar1);
  return;
}

Assistant:

llm_build_mamba(const llama_model & model, const llm_graph_params & params, ggml_cgraph * gf) : llm_graph_context(params), model(model) {
        ggml_tensor * cur;
        ggml_tensor * inpL;

        // {n_embd, n_tokens}
        inpL = build_inp_embd(model.tok_embd);

        ggml_tensor * state_copy = build_inp_s_copy();
        ggml_tensor * state_mask = build_inp_s_mask();

        for (int il = 0; il < n_layer; ++il) {
            // norm
            cur = build_norm(inpL,
                    model.layers[il].attn_norm, NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "attn_norm", il);

            //cur = build_mamba_layer(gf, cur, state_copy, state_mask, il);
            cur = build_mamba_layer(gf, cur, state_copy, state_mask, ubatch, il);

            if (il == n_layer - 1) {
                // skip computing output for unused tokens
                ggml_tensor * inp_out_ids = build_inp_out_ids();
                cur  = ggml_get_rows(ctx0,  cur, inp_out_ids);
                inpL = ggml_get_rows(ctx0, inpL, inp_out_ids);
            }

            // residual
            cur = ggml_add(ctx0, cur, inpL);

            cur = build_cvec(cur, il);
            cb(cur, "l_out", il);

            // input for next layer
            inpL = cur;
        }

        // final rmsnorm
        cur = build_norm(inpL,
                model.output_norm, NULL,
                LLM_NORM_RMS, -1);

        cb(cur, "result_norm", -1);
        res->t_embd = cur;

        // lm_head
        cur = build_lora_mm(model.output, cur);

        cb(cur, "result_output", -1);
        res->t_logits = cur;

        ggml_build_forward_expand(gf, cur);
    }